

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageinput.cc
# Opt level: O0

void __thiscall ImageInput::fwarning(ImageInput *this,string *wmsg)

{
  string *in_RSI;
  ImageInput *in_RDI;
  string fwmsg;
  string *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffd0,in_RSI);
  warning(in_RDI,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

void ImageInput::fwarning(const std::string& wmsg)
{
    std::string fwmsg = _filename + ": ";
    fwmsg += wmsg;
    warning(fwmsg);
}